

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

void __thiscall MidiEvent::MidiEvent(MidiEvent *this,char *filePath,long addr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  FILE *f;
  long addr_local;
  char *filePath_local;
  MidiEvent *this_local;
  
  Event::Event(&this->super_Event);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR__MidiEvent_00109ca8;
  (this->super_Event).field_0x9 = 0;
  *(undefined2 *)&(this->super_Event).field_0xa = 0;
  __stream = fopen(filePath,"rb");
  fseek(__stream,addr,0);
  iVar2 = getc(__stream);
  (this->super_Event).field_0x9 = (char)iVar2;
  if (((this->super_Event).field_0x9 & 0x80) == 0) {
    (this->super_Event).field_0x9 = lastStatus;
    fseek(__stream,-1,1);
  }
  else {
    lastStatus = (this->super_Event).field_0x9;
    (this->super_Event).byteLength = '\x01';
  }
  bVar1 = (this->super_Event).field_0x9 & 0xf0;
  if ((((bVar1 != 0x80) && (bVar1 != 0x90)) && (bVar1 != 0xa0)) && (bVar1 != 0xb0)) {
    if ((bVar1 == 0xc0) || (bVar1 == 0xd0)) {
      iVar2 = getc(__stream);
      *(short *)&(this->super_Event).field_0xa = (short)iVar2;
      (this->super_Event).byteLength = (this->super_Event).byteLength + '\x01';
      goto LAB_00103a43;
    }
    if (bVar1 != 0xe0) goto LAB_00103a43;
  }
  iVar2 = getc(__stream);
  iVar3 = getc(__stream);
  *(ushort *)&(this->super_Event).field_0xa = (ushort)(iVar2 << 8) | (ushort)iVar3;
  (this->super_Event).byteLength = (this->super_Event).byteLength + '\x02';
LAB_00103a43:
  fclose(__stream);
  return;
}

Assistant:

MidiEvent::MidiEvent(const char* filePath, long addr) {
	FILE* f = fopen(filePath, "rb");
	fseek(f, addr, SEEK_SET);
	this->status = getc(f);

	if (status & 0x80u) {
		lastStatus = status;
		byteLength = 1;
	} else {
		status = lastStatus;
		fseek(f, -1, SEEK_CUR);
	}

	switch (status & 0xF0u) {
		case 0xC0:
		case 0xD0:
			data = getc(f);
			++byteLength;
			break;
		case 0x80:
		case 0x90:
		case 0xA0:
		case 0xB0:
		case 0xE0:
			data = getc(f) << 8u | getc(f);
			byteLength += 2;
			break;
	}

	fclose(f);
}